

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5GetVarintLen(u32 iVal)

{
  undefined4 local_c;
  u32 iVal_local;
  
  if (iVal < 0x4000) {
    local_c = 2;
  }
  else if (iVal < 0x200000) {
    local_c = 3;
  }
  else if (iVal < 0x10000000) {
    local_c = 4;
  }
  else {
    local_c = 5;
  }
  return local_c;
}

Assistant:

static int sqlite3Fts5GetVarintLen(u32 iVal){
#if 0
  if( iVal<(1 << 7 ) ) return 1;
#endif
  assert( iVal>=(1 << 7) );
  if( iVal<(1 << 14) ) return 2;
  if( iVal<(1 << 21) ) return 3;
  if( iVal<(1 << 28) ) return 4;
  return 5;
}